

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-test.cc
# Opt level: O0

void __thiscall
FileTest_MoveFromTemporaryInAssignmentClosesFile_Test::TestBody
          (FileTest_MoveFromTemporaryInAssignmentClosesFile_Test *this)

{
  bool bVar1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  char *unaff_retaddr;
  AssertionResult *in_stack_00000008;
  AssertHelper *in_stack_00000010;
  AssertionResult gtest_ar_;
  int old_fd;
  file f;
  int fd;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  AssertionResult *this_00;
  int *in_stack_ffffffffffffff98;
  file *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffbc;
  AssertHelper *in_stack_ffffffffffffffc0;
  AssertionResult local_38 [2];
  int local_14;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar2;
  
  uVar2 = 0xdead;
  this_00 = (AssertionResult *)&stack0xfffffffffffffff0;
  open_file();
  local_14 = fmt::v5::file::descriptor((file *)this_00);
  OpenBufferedFile(in_stack_ffffffffffffff98);
  fmt::v5::file::operator=
            ((file *)this_00,
             (file *)CONCAT17(in_stack_ffffffffffffff8f,
                              CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
  fmt::v5::file::~file(in_stack_ffffffffffffffa0);
  bVar1 = isclosed((int)((ulong)this_00 >> 0x20));
  testing::AssertionResult::AssertionResult(this_00,bVar1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_38);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_00000008,unaff_retaddr,(char *)in_RDI.ptr_,
               (char *)CONCAT44(uVar2,in_stack_fffffffffffffff0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffac,(char *)in_stack_ffffffffffffffa0);
    testing::internal::AssertHelper::operator=(in_stack_00000010,(Message *)in_stack_00000008);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    testing::Message::~Message((Message *)0x11458c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1145e6);
  fmt::v5::file::~file(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

TEST(FileTest, MoveFromTemporaryInAssignmentClosesFile) {
  int fd = 0xdead;
  file f = open_file();
  int old_fd = f.descriptor();
  f = OpenBufferedFile(fd);
  EXPECT_TRUE(isclosed(old_fd));
}